

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder_internal.h
# Opt level: O1

void __thiscall basist::huffman_decoding_table::clear(huffman_decoding_table *this)

{
  uchar *pFirst;
  int *pFirst_00;
  short *pFirst_01;
  
  pFirst = (this->m_code_sizes).m_p;
  basisu::vector<unsigned_char>::erase
            (&this->m_code_sizes,pFirst,pFirst + (this->m_code_sizes).m_size);
  pFirst_00 = (this->m_lookup).m_p;
  basisu::vector<int>::erase(&this->m_lookup,pFirst_00,pFirst_00 + (this->m_lookup).m_size);
  pFirst_01 = (this->m_tree).m_p;
  basisu::vector<short>::erase(&this->m_tree,pFirst_01,pFirst_01 + (this->m_tree).m_size);
  return;
}

Assistant:

void clear()
		{
			basisu::clear_vector(m_code_sizes);
			basisu::clear_vector(m_lookup);
			basisu::clear_vector(m_tree);
		}